

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_forward(mg_connection *c,char *addr)

{
  int iVar1;
  void **user_data;
  ns_connection *pc_00;
  bool bVar2;
  ns_connection *pc;
  connection *conn;
  char *addr_local;
  mg_connection *c_local;
  
  user_data = &c[-1].callback_param;
  pc_00 = ns_connect((ns_mgr *)c[1].request_method,addr,mg_ev_handler,user_data);
  if (pc_00 == (ns_connection *)0x0) {
    *(uint *)((long)*user_data + 0x98) = *(uint *)((long)*user_data + 0x98) | 0x10;
    c_local._4_4_ = 0;
  }
  else {
    pc_00->flags = pc_00->flags | 0x800000;
    *(undefined4 *)&c[1].http_version = 6;
    c[1].uri = (char *)pc_00;
    iVar1 = strcmp(c->request_method,"CONNECT");
    if (iVar1 == 0) {
      send(*(int *)((long)*user_data + 0x20),"HTTP/1.1 200 OK\r\n\r\n",0x13,0);
    }
    else {
      iVar1 = memcmp(c->uri,"http://",7);
      if (iVar1 == 0) {
        c->uri = c->uri + 7;
      }
      while( true ) {
        bVar2 = false;
        if (*c->uri != '\0') {
          bVar2 = *c->uri != '/';
        }
        if (!bVar2) break;
        c->uri = c->uri + 1;
      }
      proxy_request(pc_00,c);
    }
    c_local._4_4_ = 1;
  }
  return c_local._4_4_;
}

Assistant:

int mg_forward(struct mg_connection *c, const char *addr) {
  static const char ok[] = "HTTP/1.1 200 OK\r\n\r\n";
  struct connection *conn = MG_CONN_2_CONN(c);
  struct ns_connection *pc;

  if ((pc = ns_connect(&conn->server->ns_mgr, addr,
      mg_ev_handler, conn)) == NULL) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
    return 0;
  }

  // Interlink two connections
  pc->flags |= MG_PROXY_CONN;
  conn->endpoint_type = EP_PROXY;
  conn->endpoint.nc = pc;
  DBG(("%p [%s] [%s] -> %p %p", conn, c->uri, addr, pc, conn->ns_conn->ssl));

  if (strcmp(c->request_method, "CONNECT") == 0) {
    // For CONNECT request, reply with 200 OK. Tunnel is established.
    // TODO(lsm): check for send() failure
    (void) send(conn->ns_conn->sock, ok, sizeof(ok) - 1, 0);
  } else {
    // Strip "http://host:port" part from the URI
    if (memcmp(c->uri, "http://", 7) == 0) c->uri += 7;
    while (*c->uri != '\0' && *c->uri != '/') c->uri++;
    proxy_request(pc, c);
  }
  return 1;
}